

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcTypeProduct::~IfcTypeProduct(IfcTypeProduct *this)

{
  ~IfcTypeProduct((IfcTypeProduct *)&this[-1].super_IfcTypeObject.field_0x70);
  return;
}

Assistant:

IfcTypeProduct() : Object("IfcTypeProduct") {}